

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass2_strategy.c
# Opt level: O2

void process_first_pass_stats(AV1_COMP *cpi,FIRSTPASS_STATS *this_frame)

{
  AV1_PRIMARY *pAVar1;
  FIRSTPASS_STATS *pFVar2;
  int iVar3;
  STATS_BUFFER_CTX *pSVar4;
  AV1_PRIMARY *pAVar5;
  ulong uVar6;
  ulong uVar7;
  double dVar8;
  
  pAVar1 = cpi->ppi;
  pSVar4 = (pAVar1->twopass).stats_buf_ctx;
  if (((((cpi->oxcf).rc_cfg.mode == AOM_Q) || ((cpi->common).current_frame.frame_number != 0)) ||
      (cpi->gf_frame_index != '\0')) ||
     ((pSVar4->total_stats == (FIRSTPASS_STATS *)0x0 ||
      (pSVar4->total_left_stats == (FIRSTPASS_STATS *)0x0)))) goto LAB_001d4bca;
  pAVar5 = pAVar1;
  if (pAVar1->lap_enabled == 0) {
LAB_001d4c4c:
    uVar6 = (pAVar5->twopass).bits_left /
            (long)(int)(((pAVar5->twopass).stats_buf_ctx)->total_stats->count -
                       (double)(cpi->common).current_frame.frame_number);
    uVar7 = 0x7fffffff;
    if ((long)uVar6 < 0x7fffffff) {
      uVar7 = uVar6;
    }
  }
  else {
    memcpy(pSVar4->total_left_stats,pSVar4->total_stats,0xe8);
    pAVar5 = cpi->ppi;
    if (pAVar5->lap_enabled == 0) goto LAB_001d4c4c;
    uVar7 = (ulong)(uint)(cpi->rc).avg_frame_bandwidth;
  }
  pFVar2 = ((pAVar1->twopass).stats_buf_ctx)->total_left_stats;
  dVar8 = pFVar2->count;
  iVar3 = get_twopass_worst_quality
                    (cpi,pFVar2->coded_error / dVar8,
                     (pFVar2->inactive_zone_rows + pFVar2->inactive_zone_rows) /
                     ((double)(cpi->common).mi_params.mb_rows * dVar8) +
                     pFVar2->intra_skip_pct / dVar8,(int)uVar7);
  (cpi->rc).active_worst_quality = iVar3;
  (cpi->rc).ni_av_qi = iVar3;
  (pAVar1->p_rc).last_q[1] = iVar3;
  dVar8 = av1_convert_qindex_to_q(iVar3,((cpi->common).seq_params)->bit_depth);
  (pAVar1->p_rc).avg_q = dVar8;
  (pAVar1->p_rc).avg_frame_qindex[1] = iVar3;
  iVar3 = (iVar3 + (cpi->oxcf).rc_cfg.best_allowed_q) / 2;
  (pAVar1->p_rc).last_q[0] = iVar3;
  (pAVar1->p_rc).avg_frame_qindex[0] = iVar3;
  pSVar4 = (pAVar1->twopass).stats_buf_ctx;
LAB_001d4bca:
  pFVar2 = (cpi->twopass_frame).stats_in;
  if (pFVar2 < pSVar4->stats_in_end) {
    memcpy(this_frame,pFVar2,0xe8);
    (cpi->twopass_frame).stats_in = (cpi->twopass_frame).stats_in + 1;
  }
  set_twopass_params_based_on_fp_stats(cpi,this_frame);
  return;
}

Assistant:

static void process_first_pass_stats(AV1_COMP *cpi,
                                     FIRSTPASS_STATS *this_frame) {
  AV1_COMMON *const cm = &cpi->common;
  CurrentFrame *const current_frame = &cm->current_frame;
  RATE_CONTROL *const rc = &cpi->rc;
  PRIMARY_RATE_CONTROL *const p_rc = &cpi->ppi->p_rc;
  TWO_PASS *const twopass = &cpi->ppi->twopass;
  FIRSTPASS_STATS *total_stats = twopass->stats_buf_ctx->total_stats;

  if (cpi->oxcf.rc_cfg.mode != AOM_Q && current_frame->frame_number == 0 &&
      cpi->gf_frame_index == 0 && total_stats &&
      twopass->stats_buf_ctx->total_left_stats) {
    if (cpi->ppi->lap_enabled) {
      /*
       * Accumulate total_stats using available limited number of stats,
       * and assign it to total_left_stats.
       */
      *twopass->stats_buf_ctx->total_left_stats = *total_stats;
    }
    // Special case code for first frame.
    const int section_target_bandwidth = get_section_target_bandwidth(cpi);
    const double section_length =
        twopass->stats_buf_ctx->total_left_stats->count;
    const double section_error =
        twopass->stats_buf_ctx->total_left_stats->coded_error / section_length;
    const double section_intra_skip =
        twopass->stats_buf_ctx->total_left_stats->intra_skip_pct /
        section_length;
    const double section_inactive_zone =
        (twopass->stats_buf_ctx->total_left_stats->inactive_zone_rows * 2) /
        ((double)cm->mi_params.mb_rows * section_length);
    const int tmp_q = get_twopass_worst_quality(
        cpi, section_error, section_intra_skip + section_inactive_zone,
        section_target_bandwidth);

    rc->active_worst_quality = tmp_q;
    rc->ni_av_qi = tmp_q;
    p_rc->last_q[INTER_FRAME] = tmp_q;
    p_rc->avg_q = av1_convert_qindex_to_q(tmp_q, cm->seq_params->bit_depth);
    p_rc->avg_frame_qindex[INTER_FRAME] = tmp_q;
    p_rc->last_q[KEY_FRAME] = (tmp_q + cpi->oxcf.rc_cfg.best_allowed_q) / 2;
    p_rc->avg_frame_qindex[KEY_FRAME] = p_rc->last_q[KEY_FRAME];
  }

  if (cpi->twopass_frame.stats_in < twopass->stats_buf_ctx->stats_in_end) {
    *this_frame = *cpi->twopass_frame.stats_in;
    ++cpi->twopass_frame.stats_in;
  }
  set_twopass_params_based_on_fp_stats(cpi, this_frame);
}